

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::insert(Heap<Gluco::SimpSolver::ElimLt> *this,int n)

{
  int *piVar1;
  int n_local;
  int local_14;
  
  _n_local = CONCAT44(0xffffffff,n);
  vec<int>::growTo(&this->indices,n + 1,&local_14);
  piVar1 = (this->indices).data;
  if ((n < (this->indices).sz) && (-1 < piVar1[n])) {
    __assert_fail("!inHeap(n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Heap.h"
                  ,0x68,
                  "void Gluco::Heap<Gluco::SimpSolver::ElimLt>::insert(int) [Comp = Gluco::SimpSolver::ElimLt]"
                 );
  }
  piVar1[n] = (this->heap).sz;
  vec<int>::push(&this->heap,&n_local);
  percolateUp(this,(this->indices).data[n_local]);
  return;
}

Assistant:

void insert(int n)
    {
        indices.growTo(n+1, -1);
        assert(!inHeap(n));

        indices[n] = heap.size();
        heap.push(n);
        percolateUp(indices[n]); 
    }